

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall soul::AST::ComplexMemberRef::~ComplexMemberRef(ComplexMemberRef *this)

{
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ComplexMemberRef_002f9600;
  std::__cxx11::string::~string((string *)&this->memberName);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&(this->memberType).structure);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&(this->complexType).structure);
  ASTObject::~ASTObject((ASTObject *)this);
  return;
}

Assistant:

ComplexMemberRef (const Context& c, Expression& o, Type t, std::string member)
            : Expression (ObjectType::ComplexMemberRef, c, ExpressionKind::value),
              object (o), complexType (t), memberName (std::move (member))
        {
            SOUL_ASSERT (t.isComplex());
            SOUL_ASSERT (isPossiblyValue (object.get()));

            if (complexType.isVector())
                memberType = Type::createVector (complexType.getElementType().isComplex32() ? PrimitiveType::float32 : PrimitiveType::float64, complexType.getVectorSize());
            else
                memberType = complexType.isComplex32() ? PrimitiveType::float32 : PrimitiveType::float64;
        }